

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_info.cc
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *this;
  allocator *paVar2;
  size_type this_00;
  pointer this_01;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  long *plVar10;
  string *psVar11;
  undefined1 *extraout_RAX;
  undefined1 *extraout_RAX_00;
  undefined1 *puVar12;
  int *piVar13;
  pointer pwVar14;
  int64_t iVar15;
  size_t sVar16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar17;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  pointer pwVar18;
  undefined8 extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  long lVar20;
  long lVar21;
  char *pcVar22;
  Interface *this_02;
  undefined4 in_register_0000003c;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *this_03;
  ulong uVar23;
  byte bVar24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var25;
  bool bVar26;
  shared_ptr<rcg::Device> sVar27;
  undefined1 auVar28 [12];
  string devid;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> interf;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> system;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> device;
  shared_ptr<rcg::Device> dev;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> device_1;
  string key;
  undefined1 local_168 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Alloc_hider local_138;
  undefined8 local_120;
  undefined1 local_118 [32];
  string local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  local_d0;
  pointer local_b8;
  pointer local_b0;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> local_a8;
  undefined4 local_90;
  int local_8c;
  ulong local_88;
  char *local_80;
  undefined1 local_78 [32];
  long local_58;
  string local_50;
  
  local_d8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_0000003c,argc);
  if (1 < argc) {
    std::__cxx11::string::string((string *)local_168,argv[1],(allocator *)local_118);
    iVar4 = std::__cxx11::string::compare(local_168);
    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
    }
    if (iVar4 != 0) {
      std::__cxx11::string::string((string *)local_168,argv[1],(allocator *)(local_168 + 0x20));
      iVar4 = std::__cxx11::string::compare(local_168);
      if (iVar4 == 0) {
        bVar26 = true;
      }
      else {
        std::__cxx11::string::string((string *)local_118,argv[1],(allocator *)(local_118 + 0x20));
        iVar4 = std::__cxx11::string::compare(local_118);
        bVar26 = iVar4 == 0;
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_);
        }
      }
      if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
      }
      if (bVar26) {
        std::__cxx11::string::string((string *)local_168,argv[1],(allocator *)local_118);
        pcVar22 = "-L";
        uVar5 = std::__cxx11::string::compare(local_168);
        local_b0 = (pointer)CONCAT44(local_b0._4_4_,uVar5);
        if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
        }
        rcg::System::getSystems();
        if (local_118._8_8_ != local_118._0_8_) {
          pwVar14 = (pointer)0x0;
          uVar17 = extraout_RDX;
          do {
            local_120 = (long)pwVar14 * 0x10;
            rcg::System::open(*(System **)(local_120 + local_118._0_8_),pcVar22,(int)uVar17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Transport Layer ",0x10);
            rcg::System::getID_abi_cxx11_
                      ((string *)local_168,*(System **)(local_118._0_8_ + local_120));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_168._1_7_,local_168[0])
                                ,local_168._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Vendor:         ",0x10);
            rcg::System::getVendor_abi_cxx11_
                      ((string *)local_168,*(System **)(local_118._0_8_ + local_120));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_168._1_7_,local_168[0])
                                ,local_168._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Model:          ",0x10);
            rcg::System::getModel_abi_cxx11_
                      ((string *)local_168,*(System **)(local_118._0_8_ + local_120));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_168._1_7_,local_168[0])
                                ,local_168._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Vendor version: ",0x10);
            rcg::System::getVersion_abi_cxx11_
                      ((string *)local_168,*(System **)(local_118._0_8_ + local_120));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_168._1_7_,local_168[0])
                                ,local_168._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"TL type:        ",0x10);
            rcg::System::getTLType_abi_cxx11_
                      ((string *)local_168,*(System **)(local_118._0_8_ + local_120));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_168._1_7_,local_168[0])
                                ,local_168._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Name:           ",0x10);
            rcg::System::getName_abi_cxx11_
                      ((string *)local_168,*(System **)(local_118._0_8_ + local_120));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_168._1_7_,local_168[0])
                                ,local_168._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Pathname:       ",0x10);
            rcg::System::getPathname_abi_cxx11_
                      ((string *)local_168,*(System **)(local_118._0_8_ + local_120));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_168._1_7_,local_168[0])
                                ,local_168._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Display name:   ",0x10);
            rcg::System::getDisplayName_abi_cxx11_
                      ((string *)local_168,*(System **)(local_118._0_8_ + local_120));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_168._1_7_,local_168[0])
                                ,local_168._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"GenTL version   ",0x10);
            iVar4 = rcg::System::getMajorVersion(*(System **)(local_118._0_8_ + local_120));
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
            iVar4 = rcg::System::getMinorVersion(*(System **)(local_118._0_8_ + local_120));
            plVar10 = (long *)std::ostream::operator<<((ostream *)poVar9,iVar4);
            std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
            std::ostream::put((char)plVar10);
            std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
            std::ostream::put(-8);
            std::ostream::flush();
            pcVar22 = *(char **)(local_118._0_8_ + local_120);
            rcg::System::getInterfaces
                      ((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                        *)(local_168 + 0x20),(System *)pcVar22);
            uVar17 = extraout_RDX_00;
            if ((int)local_b0 == 0) {
              rcg::System::getNodeMap((System *)local_168);
              rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)local_168,"Root",100,true);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
              }
              cVar3 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
              pcVar22 = (char *)(ulong)(uint)(int)cVar3;
              std::ostream::put(-8);
              std::ostream::flush();
              uVar17 = extraout_RDX_01;
            }
            local_b8 = pwVar14;
            if (local_148._8_8_ != local_148._M_allocated_capacity) {
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              do {
                lVar20 = (long)p_Var19 * 0x10;
                local_d8._M_pi = p_Var19;
                rcg::Interface::open
                          ((Interface *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_148._M_allocated_capacity + lVar20))->_M_allocated_capacity,
                           pcVar22,(int)uVar17);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    Interface     ",0x12);
                psVar11 = rcg::Interface::getID_abi_cxx11_
                                    ((Interface *)
                                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)(local_148._M_allocated_capacity + lVar20))->
                                     _M_allocated_capacity);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar11->_M_dataplus)._M_p,
                                    psVar11->_M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    Display name: ",0x12);
                rcg::Interface::getDisplayName_abi_cxx11_
                          ((string *)local_168,
                           (Interface *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_148._M_allocated_capacity + lVar20))->_M_allocated_capacity);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_168._1_7_,local_168[0]),local_168._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    TL type:      ",0x12);
                rcg::Interface::getTLType_abi_cxx11_
                          ((string *)local_168,
                           (Interface *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_148._M_allocated_capacity + lVar20))->_M_allocated_capacity);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_168._1_7_,local_168[0]),local_168._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                }
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
                std::ostream::put(-8);
                std::ostream::flush();
                pcVar22 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(local_148._M_allocated_capacity + lVar20))->
                                  _M_allocated_capacity;
                rcg::Interface::getDevices
                          ((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                            *)(local_118 + 0x20),(Interface *)pcVar22);
                if ((int)local_b0 == 0) {
                  rcg::Interface::getNodeMap((Interface *)local_168);
                  rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)local_168,"Root",100,true
                                   );
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
                  }
                  cVar3 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
                  pcVar22 = (char *)(ulong)(uint)(int)cVar3;
                  std::ostream::put(-8);
                  std::ostream::flush();
                }
                if ((pointer)local_f8._M_string_length != local_f8._M_dataplus._M_p) {
                  lVar21 = 0;
                  uVar23 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        Device             ",0x1b);
                    psVar11 = rcg::Device::getID_abi_cxx11_
                                        (*(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,(psVar11->_M_dataplus)._M_p,
                                        psVar11->_M_string_length);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        Vendor:            ",0x1b);
                    rcg::Device::getVendor_abi_cxx11_
                              ((string *)local_168,
                               *(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)CONCAT71(local_168._1_7_,local_168[0]),
                                        local_168._8_8_);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        Model:             ",0x1b);
                    rcg::Device::getModel_abi_cxx11_
                              ((string *)local_168,
                               *(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)CONCAT71(local_168._1_7_,local_168[0]),
                                        local_168._8_8_);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        TL type:           ",0x1b);
                    rcg::Device::getTLType_abi_cxx11_
                              ((string *)local_168,
                               *(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)CONCAT71(local_168._1_7_,local_168[0]),
                                        local_168._8_8_);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        Display name:      ",0x1b);
                    rcg::Device::getDisplayName_abi_cxx11_
                              ((string *)local_168,
                               *(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)CONCAT71(local_168._1_7_,local_168[0]),
                                        local_168._8_8_);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        User defined name: ",0x1b);
                    rcg::Device::getUserDefinedName_abi_cxx11_
                              ((string *)local_168,
                               *(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)CONCAT71(local_168._1_7_,local_168[0]),
                                        local_168._8_8_);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        Access status:     ",0x1b);
                    rcg::Device::getAccessStatus_abi_cxx11_
                              ((string *)local_168,
                               *(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)CONCAT71(local_168._1_7_,local_168[0]),
                                        local_168._8_8_);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        Serial number:     ",0x1b);
                    rcg::Device::getSerialNumber_abi_cxx11_
                              ((string *)local_168,
                               *(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)CONCAT71(local_168._1_7_,local_168[0]),
                                        local_168._8_8_);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        Version:           ",0x1b);
                    rcg::Device::getVersion_abi_cxx11_
                              ((string *)local_168,
                               *(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)CONCAT71(local_168._1_7_,local_168[0]),
                                        local_168._8_8_);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        TS Frequency:      ",0x1b);
                    rcg::Device::getTimestampFrequency
                              (*(Device **)((long)local_f8._M_dataplus._M_p + lVar21));
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    cVar3 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
                    pcVar22 = (char *)(ulong)(uint)(int)cVar3;
                    std::ostream::put(-8);
                    std::ostream::flush();
                    uVar23 = uVar23 + 1;
                    lVar21 = lVar21 + 0x10;
                  } while (uVar23 < (ulong)((long)(local_f8._M_string_length -
                                                  (long)local_f8._M_dataplus._M_p) >> 4));
                }
                rcg::Interface::close
                          ((Interface *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_148._M_allocated_capacity + lVar20))->_M_allocated_capacity,
                           (int)pcVar22);
                std::
                vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                ::~vector((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                           *)(local_118 + 0x20));
                p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&(local_d8._M_pi)->_vptr__Sp_counted_base + 1);
                uVar17 = extraout_RDX_02;
              } while (p_Var19 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 ((long)(local_148._8_8_ - local_148._0_8_) >> 4));
            }
            rcg::System::close(*(System **)(local_118._0_8_ + local_120),(int)pcVar22);
            pwVar14 = local_b8;
            std::
            vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ::~vector((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                       *)(local_168 + 0x20));
            pwVar14 = (pointer)((long)&(pwVar14->
                                       super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr + 1);
            uVar17 = extraout_RDX_03;
          } while (pwVar14 < (pointer)((long)(local_118._8_8_ - local_118._0_8_) >> 4));
        }
        this_03 = (vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                   *)local_118;
      }
      else {
        std::__cxx11::string::string((string *)local_168,argv[1],(allocator *)local_118);
        iVar4 = std::__cxx11::string::compare(local_168);
        if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
        }
        if (iVar4 != 0) {
          if ((int)local_d8._M_pi == 2) {
            iVar4 = 2;
            local_b8 = (pointer)0xffffffff;
            iVar7 = 1;
            local_120 = (char *)0x0;
            local_80 = (char *)0x0;
            local_88 = 0;
            local_b0 = (pointer)0x0;
            bVar24 = 0;
          }
          else {
            iVar7 = 1;
            local_b8 = (pointer)0xffffffff;
            iVar4 = 2;
            local_b0 = (pointer)0x0;
            local_88 = 0;
            local_80 = (char *)0x0;
            local_120 = (char *)0x0;
            do {
              if (*argv[iVar7] != '-') {
                bVar24 = 1;
                break;
              }
              std::__cxx11::string::string((string *)local_168,argv[iVar7],(allocator *)local_118);
              iVar6 = std::__cxx11::string::compare(local_168);
              if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
              }
              if (iVar6 == 0) {
                pcVar22 = argv[iVar4];
                std::__cxx11::string::string((string *)local_168,pcVar22,(allocator *)local_118);
                iVar4 = std::__cxx11::string::compare(local_168);
                if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                }
                local_120 = pcVar22;
                if (iVar4 == 0) {
                  local_120 = "";
                }
LAB_0010aa6b:
                iVar4 = iVar7 + 2;
              }
              else {
                std::__cxx11::string::string((string *)local_168,argv[iVar7],(allocator *)local_118)
                ;
                iVar6 = std::__cxx11::string::compare(local_168);
                if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                }
                if (iVar6 == 0) {
                  std::__cxx11::string::string
                            ((string *)local_168,argv[iVar4],(allocator *)(local_168 + 0x20));
                  pcVar22 = (char *)CONCAT71(local_168._1_7_,local_168[0]);
                  piVar13 = __errno_location();
                  iVar4 = *piVar13;
                  *piVar13 = 0;
                  pwVar14 = (pointer)strtol(pcVar22,(char **)local_118,10);
                  if ((char *)local_118._0_8_ != pcVar22) {
                    if (((pointer)(long)(int)pwVar14 == pwVar14) && (*piVar13 != 0x22)) {
                      if (*piVar13 == 0) {
                        *piVar13 = iVar4;
                      }
                      local_b8 = pwVar14;
                      if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10)
                      {
                        operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                      }
                      goto LAB_0010aa6b;
                    }
                    std::__throw_out_of_range("stoi");
                  }
                  auVar28 = std::__throw_invalid_argument("stoi");
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8.
                         super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_a8.
                               super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  if ((Device *)
                      local_d0.
                      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish != (Device *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
                    operator_delete((void *)local_118._0_8_);
                  }
                  if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                    operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                  }
                  if (auVar28._8_4_ != 1) {
                    _Unwind_Resume(auVar28._0_8_);
                  }
                  plVar10 = (long *)__cxa_begin_catch(auVar28._0_8_);
                  pcVar22 = (char *)(**(code **)(*plVar10 + 0x10))(plVar10);
                  if (pcVar22 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x134678);
                  }
                  else {
                    sVar16 = strlen(pcVar22);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pcVar22,sVar16);
                  }
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
                  std::ostream::put('x');
                  std::ostream::flush();
                  __cxa_end_catch();
                  iVar4 = 2;
                  goto LAB_001096ae;
                }
                std::__cxx11::string::string((string *)local_168,argv[iVar7],(allocator *)local_118)
                ;
                iVar6 = std::__cxx11::string::compare(local_168);
                if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                }
                if (iVar6 == 0) {
                  local_80 = argv[iVar4];
                  goto LAB_0010aa6b;
                }
                std::__cxx11::string::string((string *)local_168,argv[iVar7],(allocator *)local_118)
                ;
                iVar6 = std::__cxx11::string::compare(local_168);
                puVar12 = local_168 + 0x10;
                if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != puVar12) {
                  operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                  puVar12 = extraout_RAX;
                }
                if (iVar6 == 0) {
                  local_88 = CONCAT71((int7)((ulong)puVar12 >> 8),1);
                }
                else {
                  std::__cxx11::string::string
                            ((string *)local_168,argv[iVar7],(allocator *)local_118);
                  iVar6 = std::__cxx11::string::compare(local_168);
                  puVar12 = local_168 + 0x10;
                  if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != puVar12) {
                    operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    puVar12 = extraout_RAX_00;
                  }
                  local_b0 = (pointer)CONCAT71((int7)((ulong)puVar12 >> 8),1);
                  if (iVar6 != 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Unknown parameter: ",0x13);
                    poVar9 = std::operator<<((ostream *)&std::cerr,argv[iVar7]);
                    iVar4 = 1;
                    std::endl<char,std::char_traits<char>>(poVar9);
                    goto LAB_001096ae;
                  }
                }
              }
              iVar7 = iVar4;
              iVar4 = iVar7 + 1;
              bVar24 = (byte)local_b0;
            } while (iVar4 < (int)local_d8._M_pi);
          }
          if ((int)local_d8._M_pi <= iVar7) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Device name not given!",0x16);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
            std::ostream::put('x');
            iVar4 = 1;
            std::ostream::flush();
            goto LAB_001096ae;
          }
          std::__cxx11::string::string((string *)local_168,argv[iVar7],(allocator *)local_118);
          local_118._0_8_ = local_118 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Root","");
          lVar20 = std::__cxx11::string::find((char)local_168,0x3f);
          local_8c = 1000;
          local_90 = (undefined4)CONCAT71((int7)((ulong)lVar20 >> 8),1);
          if (lVar20 != -1) {
            local_58 = lVar20 + 1;
            std::__cxx11::string::substr((ulong)(local_168 + 0x20),(ulong)local_168);
            iVar7 = std::__cxx11::string::compare(local_168 + 0x20);
            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_168 + 0x30);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_allocated_capacity != paVar1) {
              operator_delete((void *)local_148._M_allocated_capacity);
            }
            if (iVar7 == 0) {
              std::__cxx11::string::operator=((string *)local_118,"");
              std::__cxx11::string::substr((ulong)(local_168 + 0x20),(ulong)local_168);
              std::__cxx11::string::operator=((string *)local_168,(string *)(local_168 + 0x20));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_allocated_capacity != paVar1) {
                operator_delete((void *)local_148._M_allocated_capacity);
              }
            }
            else {
              std::__cxx11::string::substr((ulong)(local_168 + 0x20),(ulong)local_168);
              std::__cxx11::string::operator=((string *)local_118,(string *)(local_168 + 0x20));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_allocated_capacity != paVar1) {
                operator_delete((void *)local_148._M_allocated_capacity);
              }
              std::__cxx11::string::substr((ulong)(local_168 + 0x20),(ulong)local_168);
              std::__cxx11::string::operator=((string *)local_168,(string *)(local_168 + 0x20));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_allocated_capacity != paVar1) {
                operator_delete((void *)local_148._M_allocated_capacity);
              }
              local_8c = 1;
              if ((__pthread_internal_list *)local_118._8_8_ == (__pthread_internal_list *)0x0) {
                std::__cxx11::string::operator=((string *)local_118,"Root");
              }
              local_90 = 0;
            }
          }
          sVar27 = rcg::getDevice((rcg *)&local_d0,(char *)CONCAT71(local_168._1_7_,local_168[0]));
          if ((Device *)
              local_d0.
              super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (Device *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Device \'",8);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)CONCAT71(local_168._1_7_,local_168[0])
                                ,local_168._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\' not found!",0xc);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            iVar4 = 1;
            std::ostream::flush();
          }
          else {
            rcg::Device::open((Device *)
                              local_d0.
                              super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (char *)(ulong)((bVar24 | local_80 != (char *)0x0) & 1),
                              (int)sVar27.
                                   super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
            local_a8.
            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8.
            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            if ((local_88 & 1) == 0) {
              rcg::Device::getRemoteNodeMap
                        ((Device *)(local_168 + 0x20),
                         (char *)local_d0.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
            }
            else {
              rcg::Device::getNodeMap
                        ((Device *)(local_168 + 0x20),
                         (char *)local_d0.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
            }
            this_01 = local_a8.
                      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_a8.
            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
            local_a8.
            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_148._M_allocated_capacity;
            local_148._M_allocated_capacity = 0;
            local_148._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_148._8_8_ !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
            }
            if (-1 < (int)local_b8) {
              rcg::Device::enableModuleEvents
                        ((Device *)
                         local_d0.
                         super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              local_f8._M_dataplus._M_p = (pointer)0x0;
              local_f8._M_string_length = 0;
              rcg::Device::getNodeMap
                        ((Device *)(local_168 + 0x20),
                         (char *)local_d0.
                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              this_00 = local_f8._M_string_length;
              local_f8._M_string_length = local_148._8_8_;
              local_f8._M_dataplus._M_p = (pointer)local_148._M_allocated_capacity;
              local_148._M_allocated_capacity = 0;
              local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (((element_type *)this_00 != (element_type *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
              }
              local_148._M_allocated_capacity = 0;
              local_148._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_138._M_p = (pointer)0x0;
              rcg::getEnum(&local_50,(shared_ptr<GenApi_3_4::CNodeMapRef> *)(local_118 + 0x20),
                           "EventSelector",
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(local_168 + 0x20),false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              if (local_148._8_8_ != local_148._M_allocated_capacity) {
                lVar20 = 0;
                uVar23 = 0;
                do {
                  rcg::setEnum((shared_ptr<GenApi_3_4::CNodeMapRef> *)(local_118 + 0x20),
                               "EventSelector",*(char **)(local_148._M_allocated_capacity + lVar20),
                               true);
                  rcg::setEnum((shared_ptr<GenApi_3_4::CNodeMapRef> *)(local_118 + 0x20),
                               "EventNotification","On",false);
                  uVar23 = uVar23 + 1;
                  lVar20 = lVar20 + 0x20;
                } while (uVar23 < (ulong)((long)(local_148._8_8_ - local_148._0_8_) >> 5));
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_168 + 0x20));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_string_length !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length
                          );
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8.
                   super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              pcVar22 = "Nodemap not available!";
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Nodemap not available!",0x16);
              iVar4 = 0;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            }
            else {
              iVar7 = (int)local_d8._M_pi;
              uVar8 = iVar7 - iVar4;
              local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar8;
              if (uVar8 != 0 && iVar4 <= iVar7) {
                lVar20 = 0;
                this = (string *)(local_168 + 0x20);
                paVar2 = (allocator *)(local_118 + 0x20);
                do {
                  std::__cxx11::string::string(this,argv[iVar4 + lVar20],paVar2);
                  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_148._8_8_ ==
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0) || (*(char *)local_148._M_allocated_capacity != '@')) {
                    lVar21 = std::__cxx11::string::find((char)this,0x3d);
                    if (lVar21 != -1) {
                      std::__cxx11::string::find((char)this,0x3d);
                      std::__cxx11::string::substr((ulong)paVar2,(ulong)this);
                      std::__cxx11::string::substr((ulong)local_78,(ulong)this);
                      rcg::setString((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_a8,
                                     (char *)local_78._0_8_,local_f8._M_dataplus._M_p,true);
                      if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
                        operator_delete((void *)local_78._0_8_);
                      }
                      goto LAB_0010b00f;
                    }
                    rcg::callCommand((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_a8,
                                     (char *)local_148._M_allocated_capacity,true);
                  }
                  else {
                    std::__cxx11::string::substr((ulong)paVar2,(ulong)this);
                    rcg::loadStreamableParameters
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_a8,
                               local_f8._M_dataplus._M_p,true);
LAB_0010b00f:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._M_dataplus._M_p !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&local_f8 + 0x10U)) {
                      operator_delete(local_f8._M_dataplus._M_p);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_148._M_allocated_capacity !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_168 + 0x30)) {
                    operator_delete((void *)local_148._M_allocated_capacity);
                  }
                  lVar20 = lVar20 + 1;
                } while ((int)local_d8._M_pi != (int)lVar20);
              }
              if (-1 < (int)local_b8) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Waiting for events",0x12);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                iVar15 = rcg::Device::getModuleEvent
                                   ((Device *)
                                    local_d0.
                                    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (ulong)(uint)((int)local_b8 * 1000));
                if (iVar15 < 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Received no module events",0x19);
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                }
                while (-1 < iVar15) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Received module event with ID: ",0x1f);
                  poVar9 = std::ostream::_M_insert<long>((long)&std::cout);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                  std::ostream::put((char)poVar9);
                  std::ostream::flush();
                  iVar15 = rcg::Device::getModuleEvent
                                     ((Device *)
                                      local_d0.
                                      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,0);
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              if (((ulong)local_b0 & 1) == 0) {
                iVar4 = 0;
                if ((__pthread_internal_list *)local_118._8_8_ != (__pthread_internal_list *)0x0) {
                  if ((char)local_90 == '\0') {
                    bVar26 = rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_a8,
                                               (char *)local_118._0_8_,1,true);
                    if (!bVar26) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Unknown node: ",0xe);
                      goto LAB_0010b67e;
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Device:            ",0x13);
                    psVar11 = rcg::Device::getID_abi_cxx11_
                                        ((Device *)
                                         local_d0.
                                         super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,(psVar11->_M_dataplus)._M_p,
                                        psVar11->_M_string_length);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Vendor:            ",0x13);
                    rcg::Device::getVendor_abi_cxx11_
                              ((string *)(local_168 + 0x20),
                               (Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)local_148._M_allocated_capacity,local_148._8_8_);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(local_168 + 0x30);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_allocated_capacity != paVar1) {
                      operator_delete((void *)local_148._M_allocated_capacity);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Model:             ",0x13);
                    rcg::Device::getModel_abi_cxx11_
                              ((string *)(local_168 + 0x20),
                               (Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)local_148._M_allocated_capacity,local_148._8_8_);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_allocated_capacity != paVar1) {
                      operator_delete((void *)local_148._M_allocated_capacity);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"TL type:           ",0x13);
                    rcg::Device::getTLType_abi_cxx11_
                              ((string *)(local_168 + 0x20),
                               (Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)local_148._M_allocated_capacity,local_148._8_8_);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_allocated_capacity != paVar1) {
                      operator_delete((void *)local_148._M_allocated_capacity);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Display name:      ",0x13);
                    rcg::Device::getDisplayName_abi_cxx11_
                              ((string *)(local_168 + 0x20),
                               (Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)local_148._M_allocated_capacity,local_148._8_8_);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_allocated_capacity != paVar1) {
                      operator_delete((void *)local_148._M_allocated_capacity);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"User defined name: ",0x13);
                    rcg::Device::getUserDefinedName_abi_cxx11_
                              ((string *)(local_168 + 0x20),
                               (Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)local_148._M_allocated_capacity,local_148._8_8_);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_allocated_capacity != paVar1) {
                      operator_delete((void *)local_148._M_allocated_capacity);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Serial number:     ",0x13);
                    rcg::Device::getSerialNumber_abi_cxx11_
                              ((string *)(local_168 + 0x20),
                               (Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)local_148._M_allocated_capacity,local_148._8_8_);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_allocated_capacity != paVar1) {
                      operator_delete((void *)local_148._M_allocated_capacity);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Version:           ",0x13);
                    rcg::Device::getVersion_abi_cxx11_
                              ((string *)(local_168 + 0x20),
                               (Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        (char *)local_148._M_allocated_capacity,local_148._8_8_);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_allocated_capacity != paVar1) {
                      operator_delete((void *)local_148._M_allocated_capacity);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"TS Frequency:      ",0x13);
                    rcg::Device::getTimestampFrequency
                              ((Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::endl<char,std::char_traits<char>>(poVar9);
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    rcg::Device::getStreams
                              ((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                *)(local_168 + 0x20),
                               (Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Available streams:",0x12);
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    if (local_148._8_8_ != local_148._M_allocated_capacity) {
                      lVar20 = 0;
                      uVar23 = 0;
                      do {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"  Stream ID: ",0xd);
                        psVar11 = rcg::Stream::getID_abi_cxx11_
                                            (*(Stream **)(local_148._M_allocated_capacity + lVar20))
                        ;
                        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)&std::cout,(psVar11->_M_dataplus)._M_p,
                                            psVar11->_M_string_length);
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) +
                                        (char)poVar9);
                        std::ostream::put((char)poVar9);
                        std::ostream::flush();
                        uVar23 = uVar23 + 1;
                        lVar20 = lVar20 + 0x10;
                      } while (uVar23 < (ulong)((long)(local_148._8_8_ - local_148._0_8_) >> 4));
                    }
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    pcVar22 = "Remote device nodemap:";
                    if ((local_88 & 1) != 0) {
                      pcVar22 = "Local device nodemap:";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar22,0x16 - (ulong)((uint)local_88 & 1));
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_a8,
                                      (char *)local_118._0_8_,local_8c,true);
                    std::
                    vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                    ::~vector((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                               *)(local_168 + 0x20));
                  }
                }
              }
              else {
                bVar26 = rcg::editNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_a8,
                                          (char *)local_118._0_8_);
                iVar4 = 0;
                if (!bVar26) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Unknown node: ",0xe);
LAB_0010b67e:
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cerr,(char *)local_118._0_8_,local_118._8_8_)
                  ;
                  iVar4 = 1;
                  std::endl<char,std::char_traits<char>>(poVar9);
                }
              }
              pcVar22 = local_80;
              if (local_80 != (char *)0x0) {
                rcg::saveStreamableParameters
                          ((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_a8,local_80,true);
              }
            }
            rcg::Device::close((Device *)
                               local_d0.
                               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,(int)pcVar22);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8.
                   super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a8.
                         super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          if ((Device *)
              local_d0.
              super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (Device *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_d0.
                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
            operator_delete((void *)local_118._0_8_);
          }
          if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
          }
          goto LAB_001096ae;
        }
        rcg::System::getSystems();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Interface\tSerial Number\tVendor\tModel\tName",0x29);
        cVar3 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        this_02 = (Interface *)(ulong)(uint)(int)cVar3;
        std::ostream::put(-8);
        std::ostream::flush();
        if (local_78._8_8_ != local_78._0_8_) {
          pwVar14 = (pointer)0x0;
          uVar17 = extraout_RDX_04;
          do {
            rcg::System::open((((pointer)(local_78._0_8_ + pwVar14 * 0x10))->
                              super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                              (char *)this_02,(int)uVar17);
            this_02 = (Interface *)
                      (((pointer)(local_78._0_8_ + pwVar14 * 0x10))->
                      super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_b8 = pwVar14;
            rcg::System::getInterfaces(&local_d0,(System *)this_02);
            uVar17 = (char *)((long)pwVar14 * 0x10);
            if (local_d0.
                super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_d0.
                super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              pwVar18 = (pointer)0x0;
              local_120 = (char *)((long)pwVar14 * 0x10);
              do {
                _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)pwVar18 * 0x10);
                local_b0 = pwVar18;
                rcg::Interface::open
                          (*(Interface **)
                            ((long)&(_Var25._M_pi)->_vptr__Sp_counted_base +
                            (long)&(local_d0.
                                    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>),
                           (char *)this_02,(int)pwVar18);
                this_02 = *(Interface **)
                           ((long)&(_Var25._M_pi)->_vptr__Sp_counted_base +
                           (long)&(local_d0.
                                   super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>);
                rcg::Interface::getDevices(&local_a8,this_02);
                if (local_a8.
                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_a8.
                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  lVar20 = 0;
                  uVar23 = 0;
                  local_d8._M_pi = _Var25._M_pi;
                  do {
                    psVar11 = rcg::Interface::getID_abi_cxx11_
                                        (*(Interface **)
                                          ((long)&(_Var25._M_pi)->_vptr__Sp_counted_base +
                                          (long)&(local_d0.
                                                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                                          ));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,(psVar11->_M_dataplus)._M_p,
                                        psVar11->_M_string_length);
                    local_168[0] = (string)0x9;
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_168,1);
                    rcg::Device::getSerialNumber_abi_cxx11_
                              ((string *)local_168,
                               *(Device **)
                                ((long)local_a8.
                                       super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,(char *)CONCAT71(local_168._1_7_,local_168[0]),
                                        local_168._8_8_);
                    local_118[0] = 9;
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,(char *)local_118,1);
                    rcg::Device::getVendor_abi_cxx11_
                              ((string *)local_118,
                               *(Device **)
                                ((long)local_a8.
                                       super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,(char *)local_118._0_8_,local_118._8_8_);
                    local_148._M_local_buf[0] = 9;
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,(char *)(local_168 + 0x20),1);
                    rcg::Device::getModel_abi_cxx11_
                              ((string *)(local_168 + 0x20),
                               *(Device **)
                                ((long)local_a8.
                                       super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,(char *)local_148._M_allocated_capacity,
                                        local_148._8_8_);
                    local_f8._M_dataplus._M_p._0_1_ = 9;
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,(char *)(local_118 + 0x20),1);
                    rcg::Device::getDisplayName_abi_cxx11_
                              ((string *)(local_118 + 0x20),
                               *(Device **)
                                ((long)local_a8.
                                       super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20));
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,local_f8._M_dataplus._M_p,local_f8._M_string_length);
                    cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) +
                                            (char)poVar9);
                    this_02 = (Interface *)(ulong)(uint)(int)cVar3;
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._M_dataplus._M_p !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&local_f8 + 0x10U)) {
                      operator_delete(local_f8._M_dataplus._M_p);
                    }
                    _Var25._M_pi = local_d8._M_pi;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_allocated_capacity !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_168 + 0x30)) {
                      operator_delete((void *)local_148._M_allocated_capacity);
                    }
                    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
                      operator_delete((void *)local_118._0_8_);
                    }
                    if ((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]) != local_168 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_168._1_7_,local_168[0]));
                    }
                    uVar23 = uVar23 + 1;
                    lVar20 = lVar20 + 0x10;
                  } while (uVar23 < (ulong)((long)local_a8.
                                                  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_a8.
                                                  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4));
                }
                rcg::Interface::close
                          (*(Interface **)
                            ((long)&(_Var25._M_pi)->_vptr__Sp_counted_base +
                            (long)&(local_d0.
                                    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>),
                           (int)this_02);
                std::
                vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                ::~vector(&local_a8);
                pwVar18 = (pointer)((long)&(local_b0->
                                           super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + 1);
                uVar17 = local_120;
              } while (pwVar18 < (pointer)((long)local_d0.
                                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_d0.
                                                 super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
            rcg::System::close(*(System **)
                                (uVar17 + (long)(__shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>
                                                 *)local_78._0_8_),(int)this_02);
            std::
            vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ::~vector(&local_d0);
            pwVar14 = (pointer)((long)&(local_b8->
                                       super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr + 1);
            uVar17 = extraout_RDX_05;
          } while (pwVar14 < (pointer)((long)(local_78._8_8_ - local_78._0_8_) >> 4));
        }
        this_03 = (vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                   *)local_78;
      }
      std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
      ~vector(this_03);
      iVar4 = 0;
      goto LAB_001096ae;
    }
  }
  pcVar22 = *argv;
  if (pcVar22 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1343f8);
  }
  else {
    sVar16 = strlen(pcVar22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar22,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             " -h | -L | -l | -s | ([-o <xml-output-file>|.] [-m <timeout>] [-p <file>] [-d] [-e] [<interface-id>:]<device-id>[?<node>] [@<file>] [<key>=<value>] ...)"
             ,0x98);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Provides information about GenICam transport layers, interfaces and devices.",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Options: ",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-h   Prints help information and exits",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-L   List all available devices on all interfaces (extended format)",0x43);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-l   List all available devices on all interfaces",0x31);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-s   List all available devices on all interfaces (short format)",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-o   Store XML description from specified device",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-m   Registers for module events and waits for the given number of seconds for such events"
             ,0x5a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-d   Use local device nodemap, instead of remote nodemap",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-e   Open nodemap editor instead of printing nodemap",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-p   Store all streamable parameters to the given file, after applying all parameters"
             ,0x55);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parameters:",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<interface-id> Optional GenICam ID of interface for connecting to the device",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<device-id>    GenICam device ID, serial number or user defined name of device",0x4e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<node>         Optional name of category or parameter to be reported. \'-\' for none. Default is \'Root\'."
             ,0x66);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "@<file>        Optional file with parameters as store with parameter \'-p\'",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<key>=<value>  Optional GenICam parameters to be changed in the given order before reporting"
             ,0x5c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  iVar4 = 1;
  std::ostream::flush();
LAB_001096ae:
  rcg::System::clearSystems();
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
  int ret=0;

  try
  {
    if (argc >= 2 && std::string(argv[1]) != "-h")
    {
      if (std::string(argv[1]) == "-L" || std::string(argv[1]) == "-l")
      {
        bool extended=(std::string(argv[1]) == "-L");

        // list all systems, interfaces and devices

        std::vector<std::shared_ptr<rcg::System> > system=rcg::System::getSystems();

        for (size_t i=0; i<system.size(); i++)
        {
          system[i]->open();

          std::cout << "Transport Layer " << system[i]->getID() << std::endl;
          std::cout << "Vendor:         " << system[i]->getVendor() << std::endl;
          std::cout << "Model:          " << system[i]->getModel() << std::endl;
          std::cout << "Vendor version: " << system[i]->getVersion() << std::endl;
          std::cout << "TL type:        " << system[i]->getTLType() << std::endl;
          std::cout << "Name:           " << system[i]->getName() << std::endl;
          std::cout << "Pathname:       " << system[i]->getPathname() << std::endl;
          std::cout << "Display name:   " << system[i]->getDisplayName() << std::endl;
          std::cout << "GenTL version   " << system[i]->getMajorVersion() << "."
                    << system[i]->getMinorVersion() << std::endl;
          std::cout << std::endl;

          std::vector<std::shared_ptr<rcg::Interface> > interf=system[i]->getInterfaces();

          if (extended)
          {
            rcg::printNodemap(system[i]->getNodeMap(), "Root");
            std::cout << std::endl;
          }

          for (size_t k=0; k<interf.size(); k++)
          {
            interf[k]->open();

            std::cout << "    Interface     " << interf[k]->getID() << std::endl;
            std::cout << "    Display name: " << interf[k]->getDisplayName() << std::endl;
            std::cout << "    TL type:      " << interf[k]->getTLType() << std::endl;
            std::cout << std::endl;

            std::vector<std::shared_ptr<rcg::Device> > device=interf[k]->getDevices();

            if (extended)
            {
              rcg::printNodemap(interf[k]->getNodeMap(), "Root");
              std::cout << std::endl;
            }

            for (size_t j=0; j<device.size(); j++)
            {
              std::cout << "        Device             " << device[j]->getID() << std::endl;
              std::cout << "        Vendor:            " << device[j]->getVendor() << std::endl;
              std::cout << "        Model:             " << device[j]->getModel() << std::endl;
              std::cout << "        TL type:           " << device[j]->getTLType() << std::endl;
              std::cout << "        Display name:      " << device[j]->getDisplayName() << std::endl;
              std::cout << "        User defined name: " << device[j]->getUserDefinedName() << std::endl;
              std::cout << "        Access status:     " << device[j]->getAccessStatus() << std::endl;
              std::cout << "        Serial number:     " << device[j]->getSerialNumber() << std::endl;
              std::cout << "        Version:           " << device[j]->getVersion() << std::endl;
              std::cout << "        TS Frequency:      " << device[j]->getTimestampFrequency() << std::endl;
              std::cout << std::endl;
            }

            interf[k]->close();
          }

          system[i]->close();
        }
      }
      else if (std::string(argv[1]) == "-s")
      {
        // list all systems, interfaces and devices

        std::vector<std::shared_ptr<rcg::System> > system=rcg::System::getSystems();

        std::cout << "Interface\tSerial Number\tVendor\tModel\tName" << std::endl;

        for (size_t i=0; i<system.size(); i++)
        {
          system[i]->open();

          std::vector<std::shared_ptr<rcg::Interface> > interf=system[i]->getInterfaces();

          for (size_t k=0; k<interf.size(); k++)
          {
            interf[k]->open();

            std::vector<std::shared_ptr<rcg::Device> > device=interf[k]->getDevices();

            for (size_t j=0; j<device.size(); j++)
            {
              std::cout << interf[k]->getID() << '\t'
                        << device[j]->getSerialNumber() << '\t'
                        << device[j]->getVendor() << '\t'
                        << device[j]->getModel() << '\t'
                        << device[j]->getDisplayName() << std::endl;
            }

            interf[k]->close();
          }

          system[i]->close();
        }
      }
      else
      {
        int k=1;

        // get parameters, if any

        int module_event_timeout=-1;
        const char *xml=0;
        const char *paramfile=0;
        bool local_nodemap=false;
        bool edit=false;

        while (k+1 < argc && argv[k][0] == '-')
        {
          if (std::string(argv[k]) == "-o")
          {
            k++;
            xml=argv[k++];

            if (std::string(xml) == ".")
            {
              xml="";
            }
          }
          else if (std::string(argv[k]) == "-m")
          {
            k++;
            module_event_timeout=std::stoi(std::string(argv[k++]));
          }
          else if (std::string(argv[k]) == "-p")
          {
            k++;
            paramfile=argv[k++];
          }
          else if (std::string(argv[k]) == "-d")
          {
            k++;
            local_nodemap=true;
          }
          else if (std::string(argv[k]) == "-e")
          {
            k++;
            edit=true;
          }
          else
          {
            std::cerr << "Unknown parameter: " << argv[k] << std::endl;
            ret=1;
            break;
          }
        }

        if (ret == 0)
        {
          if (k < argc)
          {
            // separate optional node name from device id

            std::string devid=argv[k++];
            std::string node="Root";
            int depth=1000;

            {
              size_t j=devid.find('?');

              if (j != std::string::npos)
              {
                if (devid.substr(j+1) != "-")
                {
                  node=devid.substr(j+1);
                  devid=devid.substr(0, j);
                  depth=1;

                  if (node.size() == 0)
                  {
                    node="Root";
                  }
                }
                else
                {
                  node="";
                  devid=devid.substr(0, j);
                }
              }
            }

            // find specific device accross all systems and interfaces

            std::shared_ptr<rcg::Device> dev=rcg::getDevice(devid.c_str());

            if (dev)
            {
              // open device and optionally change some settings

              if (k < argc || edit || paramfile)
              {
                dev->open(rcg::Device::CONTROL);
              }
              else
              {
                dev->open(rcg::Device::READONLY);
              }

              // get nodemap

              std::shared_ptr<GenApi::CNodeMapRef> nodemap;
              if (local_nodemap)
              {
                nodemap=dev->getNodeMap(xml);
              }
              else
              {
                nodemap=dev->getRemoteNodeMap(xml);
              }

              // register and enable module events

              if (module_event_timeout >= 0)
              {
                dev->enableModuleEvents();

                std::shared_ptr<GenApi::CNodeMapRef> lnodemap;
                lnodemap=dev->getNodeMap();

                std::vector<std::string> list;
                rcg::getEnum(lnodemap, "EventSelector", list, false);

                for (size_t i=0; i<list.size(); i++)
                {
                  rcg::setEnum(lnodemap, "EventSelector", list[i].c_str(), true);
                  rcg::setEnum(lnodemap, "EventNotification", "On", false);
                }
              }

              if (nodemap)
              {
                // interpret all remaining parameters

                while (k < argc)
                {
                  std::string p=argv[k++];

                  if (p.size() > 0 && p[0] == '@')
                  {
                    // load streamable parameters from file into nodemap

                    rcg::loadStreamableParameters(nodemap, p.substr(1).c_str(), true);
                  }
                  else if (p.find('=') != std::string::npos)
                  {
                    // split argument in key and value

                    size_t j=p.find('=');
                    std::string value=p.substr(j+1);
                    std::string key=p.substr(0, j);

                    // set key=value pair through GenICam

                    rcg::setString(nodemap, key.c_str(), value.c_str(), true);
                  }
                  else
                  {
                    // call the command
                    rcg::callCommand(nodemap, p.c_str(), true);
                  }
                }

                if (module_event_timeout >= 0)
                {
                  std::cout << "Waiting for events" << std::endl;

                  int64_t eventid=dev->getModuleEvent(1000*module_event_timeout);

                  if (eventid < 0)
                  {
                    std::cout << "Received no module events" << std::endl;
                  }

                  while (eventid >= 0)
                  {
                    std::cout << "Received module event with ID: " << eventid << std::endl;
                    eventid=dev->getModuleEvent(0);
                  }

                  std::cout << std::endl;
                }

                if (edit)
                {
                  if (!rcg::editNodemap(nodemap, node.c_str()))
                  {
                    std::cerr << "Unknown node: " << node << std::endl;
                    ret=1;
                  }
                }
                else if (node.size() > 0)
                {
                  if (depth > 1)
                  {
                    // report all features

                    std::cout << "Device:            " << dev->getID() << std::endl;
                    std::cout << "Vendor:            " << dev->getVendor() << std::endl;
                    std::cout << "Model:             " << dev->getModel() << std::endl;
                    std::cout << "TL type:           " << dev->getTLType() << std::endl;
                    std::cout << "Display name:      " << dev->getDisplayName() << std::endl;
                    std::cout << "User defined name: " << dev->getUserDefinedName() << std::endl;
                    std::cout << "Serial number:     " << dev->getSerialNumber() << std::endl;
                    std::cout << "Version:           " << dev->getVersion() << std::endl;
                    std::cout << "TS Frequency:      " << dev->getTimestampFrequency() << std::endl;
                    std::cout << std::endl;

                    std::vector<std::shared_ptr<rcg::Stream> > stream=dev->getStreams();

                    std::cout << "Available streams:" << std::endl;
                    for (size_t i=0; i<stream.size(); i++)
                    {
                      std::cout << "  Stream ID: " << stream[i]->getID() << std::endl;
                    }

                    std::cout << std::endl;

                    if (local_nodemap)
                    {
                      std::cout << "Local device nodemap:" << std::endl;
                    }
                    else
                    {
                      std::cout << "Remote device nodemap:" << std::endl;
                    }

                    rcg::printNodemap(nodemap, node.c_str(), depth, true);
                  }
                  else
                  {
                    // report requested node only

                    if (!rcg::printNodemap(nodemap, node.c_str(), depth, true))
                    {
                      std::cerr << "Unknown node: " << node << std::endl;
                      ret=1;
                    }
                  }
                }

                if (paramfile)
                {
                  rcg::saveStreamableParameters(nodemap, paramfile, true);
                }
              }
              else
              {
                std::cerr << "Nodemap not available!" << std::endl;
              }

              dev->close();
            }
            else
            {
              std::cerr << "Device '" << devid << "' not found!" << std::endl;
              ret=1;
            }
          }
          else
          {
            std::cerr << "Device name not given!" << std::endl;
            ret=1;
          }
        }
      }
    }
    else
    {
      std::cout << argv[0] << " -h | -L | -l | -s | ([-o <xml-output-file>|.] [-m <timeout>] [-p <file>] [-d] [-e] [<interface-id>:]<device-id>[?<node>] [@<file>] [<key>=<value>] ...)" << std::endl;
      std::cout << std::endl;
      std::cout << "Provides information about GenICam transport layers, interfaces and devices." << std::endl;
      std::cout << std::endl;
      std::cout << "Options: " << std::endl;
      std::cout << "-h   Prints help information and exits" << std::endl;
      std::cout << "-L   List all available devices on all interfaces (extended format)" << std::endl;
      std::cout << "-l   List all available devices on all interfaces" << std::endl;
      std::cout << "-s   List all available devices on all interfaces (short format)" << std::endl;
      std::cout << "-o   Store XML description from specified device" << std::endl;
      std::cout << "-m   Registers for module events and waits for the given number of seconds for such events" << std::endl;
      std::cout << "-d   Use local device nodemap, instead of remote nodemap" << std::endl;
      std::cout << "-e   Open nodemap editor instead of printing nodemap" << std::endl;
      std::cout << "-p   Store all streamable parameters to the given file, after applying all parameters" << std::endl;
      std::cout << std::endl;
      std::cout << "Parameters:" << std::endl;
      std::cout << "<interface-id> Optional GenICam ID of interface for connecting to the device" << std::endl;
      std::cout << "<device-id>    GenICam device ID, serial number or user defined name of device" << std::endl;
      std::cout << "<node>         Optional name of category or parameter to be reported. '-' for none. Default is 'Root'." << std::endl;
      std::cout << "@<file>        Optional file with parameters as store with parameter '-p'" << std::endl;
      std::cout << "<key>=<value>  Optional GenICam parameters to be changed in the given order before reporting" << std::endl;
      ret=1;
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
    ret=2;
  }

  rcg::System::clearSystems();

  return ret;
}